

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindFile
          (DescriptorIndex *this,string_view filename)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  pointer pFVar2;
  reference this_00;
  Value VVar3;
  pair<const_void_*,_int> pVar4;
  int local_90 [2];
  pair<std::nullptr_t,_int> local_88;
  DescriptorIndex *local_78;
  size_t local_70;
  string_view local_68;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_58;
  DescriptorIndex *local_50;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_48;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_40;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_38;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  it;
  DescriptorIndex *this_local;
  string_view filename_local;
  int local_10;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (DescriptorIndex *)filename._M_len;
  it._M_current = (FileEntry *)this;
  EnsureFlat(this);
  local_40._M_current =
       (FileEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
       ::begin(&this->by_name_flat_);
  local_48._M_current =
       (FileEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
       ::end(&this->by_name_flat_);
  local_50 = (DescriptorIndex *)
             absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
             ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                         *)&this->by_name_);
  local_38 = std::
             lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                       (local_40,local_48,
                        (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                        (FileCompare)local_50);
  local_58._M_current =
       (FileEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
       ::end(&this->by_name_flat_);
  bVar1 = __gnu_cxx::operator==(&local_38,&local_58);
  if (!bVar1) {
    pFVar2 = __gnu_cxx::
             __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
             ::operator->(&local_38);
    local_68 = FileEntry::name(pFVar2,this);
    local_78 = this_local;
    local_70 = filename_local._M_len;
    __y._M_str = (char *)filename_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator!=(local_68,__y);
    if (!bVar1) {
      pFVar2 = __gnu_cxx::
               __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
               ::operator->(&local_38);
      this_00 = std::
                vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ::operator[](&this->all_values_,(long)pFVar2->data_offset);
      VVar3 = EncodedEntry::value(this_00);
      filename_local._M_str = (char *)VVar3.first;
      local_10 = VVar3.second;
      goto LAB_019bc2f8;
    }
  }
  local_90[0] = 0;
  local_90[1] = 0;
  std::make_pair<decltype(nullptr),int>(&local_88.first,local_90);
  std::pair<const_void_*,_int>::pair<std::nullptr_t,_int,_true>
            ((pair<const_void_*,_int> *)&filename_local._M_str,&local_88);
LAB_019bc2f8:
  pVar4.second = local_10;
  pVar4.first = filename_local._M_str;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindFile(
    absl::string_view filename) {
  EnsureFlat();

  auto it = std::lower_bound(by_name_flat_.begin(), by_name_flat_.end(),
                             filename, by_name_.key_comp());
  return it == by_name_flat_.end() || it->name(*this) != filename
             ? std::make_pair(nullptr, 0)
             : all_values_[it->data_offset].value();
}